

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O3

void __thiscall ipx::SparseMatrix::resize(SparseMatrix *this,Int nrow,Int ncol,Int min_capacity)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer __s;
  pointer piVar1;
  
  this->nrow_ = nrow;
  this_00 = &this->colptr_;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(ncol + 1));
  piVar1 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (piVar1 != (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<int,_std::allocator<int>_>,_true>::_S_do_it(this_00);
    piVar1 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  __s = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  if (__s != piVar1) {
    memset(__s,0,((long)piVar1 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->rowidx_,(long)min_capacity);
  if ((this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage !=
      (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__shrink_to_fit_aux<std::vector<int,_std::allocator<int>_>,_true>::_S_do_it(&this->rowidx_)
    ;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->values_,(long)min_capacity);
  if ((this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&this->values_);
    return;
  }
  return;
}

Assistant:

void SparseMatrix::resize(Int nrow, Int ncol, Int min_capacity) {
    assert(nrow >= 0);
    assert(ncol >= 0);
    assert(min_capacity >= 0);
    nrow_ = nrow;
    colptr_.resize(ncol+1);
    colptr_.shrink_to_fit();
    std::fill(colptr_.begin(), colptr_.end(), 0);
    rowidx_.resize(min_capacity);
    rowidx_.shrink_to_fit();
    values_.resize(min_capacity);
    values_.shrink_to_fit();
}